

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O0

Action __thiscall
psy::C::NameCataloger::visitIdentifierDeclarator
          (NameCataloger *this,IdentifierDeclaratorSyntax *node)

{
  pointer pNVar1;
  SyntaxNode *node_00;
  SyntaxToken local_78;
  string local_40;
  string *local_20;
  string *name;
  IdentifierDeclaratorSyntax *node_local;
  NameCataloger *this_local;
  
  name = (string *)node;
  node_local = (IdentifierDeclaratorSyntax *)this;
  IdentifierDeclaratorSyntax::identifierToken(&local_78,node);
  SyntaxToken::valueText_abi_cxx11_(&local_40,&local_78);
  SyntaxToken::~SyntaxToken(&local_78);
  local_20 = &local_40;
  if ((this->withinTypedef_ & 1U) == 0) {
    pNVar1 = std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::
             operator->(&this->catalog_);
    NameCatalog::catalogUseAsNonTypeName(pNVar1,local_20);
    pNVar1 = std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::
             operator->(&this->catalog_);
    NameCatalog::catalogDefAsNonTypeName(pNVar1,local_20);
  }
  else {
    pNVar1 = std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::
             operator->(&this->catalog_);
    NameCatalog::catalogUseAsTypeName(pNVar1,local_20);
    pNVar1 = std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::
             operator->(&this->catalog_);
    NameCatalog::catalogDefAsTypeName(pNVar1,local_20);
  }
  node_00 = &IdentifierDeclaratorSyntax::initializer((IdentifierDeclaratorSyntax *)name)->
             super_SyntaxNode;
  SyntaxVisitor::visit(&this->super_SyntaxVisitor,node_00);
  std::__cxx11::string::~string((string *)&local_40);
  return Skip;
}

Assistant:

SyntaxVisitor::Action NameCataloger::visitIdentifierDeclarator(const IdentifierDeclaratorSyntax* node)
{
    const auto& name = node->identifierToken().valueText();
    if (withinTypedef_) {
        catalog_->catalogUseAsTypeName(name);
        catalog_->catalogDefAsTypeName(name);
    } else {
        catalog_->catalogUseAsNonTypeName(name);
        catalog_->catalogDefAsNonTypeName(name);
    }

    visit(node->initializer());

    return Action::Skip;
}